

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O0

DecoderResult *
ZXing::Pdf417::DecodeCodewords
          (vector<int,_std::allocator<int>_> *codewords,int numECCodewords,
          vector<int,_std::allocator<int>_> *erasures)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DecoderResult *pDVar4;
  int in_EDX;
  DecoderResult *in_RDI;
  int correctedErrorsCount;
  vector<int,_std::allocator<int>_> *in_stack_00000238;
  string *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  Error *in_stack_fffffffffffffda8;
  Error *error;
  DecoderResult *in_stack_fffffffffffffdb0;
  DecoderResult *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdb8;
  string *this_00;
  string local_230 [28];
  int in_stack_fffffffffffffdec;
  string local_210 [240];
  Error local_120;
  undefined1 local_d0 [188];
  int local_14;
  
  pDVar4 = in_RDI;
  local_14 = in_EDX;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
  if (bVar1) {
    this_00 = (string *)(local_d0 + 0x60);
    std::__cxx11::string::string(this_00);
    Error::Error((Error *)pDVar4,(char *)this_00,(short)((ulong)in_stack_fffffffffffffdb0 >> 0x30),
                 (Type)((ulong)in_stack_fffffffffffffdb0 >> 0x28),&in_stack_fffffffffffffda8->_msg);
    DecoderResult::DecoderResult(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    Error::~Error((Error *)0x2cf7d1);
    std::__cxx11::string::~string((string *)(local_d0 + 0x60));
  }
  else {
    local_d0._80_4_ = 0;
    bVar1 = CorrectErrors(in_stack_fffffffffffffdb8,
                          (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                          (int *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    if (bVar1) {
      bVar1 = VerifyCodewordCount((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda8,
                                  in_stack_fffffffffffffda4);
      if (bVar1) {
        Decode(in_stack_00000238);
        iVar2 = local_14 * 100;
        iVar3 = Size<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffda4,iVar2));
        std::__cxx11::to_string(in_stack_fffffffffffffdec);
        std::operator+(&in_stack_fffffffffffffda8->_msg,(char *)CONCAT44(iVar3,iVar2));
        pDVar4 = DecoderResult::setEcLevel
                           ((DecoderResult *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffffd98);
        DecoderResult::DecoderResult((DecoderResult *)CONCAT44(iVar3,iVar2),pDVar4);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string(local_230);
        DecoderResult::~DecoderResult((DecoderResult *)CONCAT44(iVar3,iVar2));
      }
      else {
        error = &local_120;
        std::__cxx11::string::string((string *)error);
        Error::Error((Error *)pDVar4,(char *)in_stack_fffffffffffffdb8,
                     (short)((ulong)in_stack_fffffffffffffdb0 >> 0x30),
                     (Type)((ulong)in_stack_fffffffffffffdb0 >> 0x28),&error->_msg);
        DecoderResult::DecoderResult(in_stack_fffffffffffffdb0,error);
        Error::~Error((Error *)0x2cf98a);
        std::__cxx11::string::~string((string *)&local_120);
      }
    }
    else {
      this = (DecoderResult *)local_d0;
      std::__cxx11::string::string((string *)this);
      Error::Error((Error *)pDVar4,(char *)in_stack_fffffffffffffdb8,(short)((ulong)this >> 0x30),
                   (Type)((ulong)this >> 0x28),&in_stack_fffffffffffffda8->_msg);
      DecoderResult::DecoderResult(this,in_stack_fffffffffffffda8);
      Error::~Error((Error *)0x2cf8bb);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  return in_RDI;
}

Assistant:

static DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodewords, const std::vector<int>& erasures)
{
	if (codewords.empty())
		return FormatError();

	int correctedErrorsCount = 0;
	if (!CorrectErrors(codewords, erasures, numECCodewords, correctedErrorsCount))
		return ChecksumError();

	if (!VerifyCodewordCount(codewords, numECCodewords))
		return FormatError();

	// Decode the codewords
	return Decode(codewords).setEcLevel(std::to_string(numECCodewords * 100 / Size(codewords)) + "%");
}